

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O3

void m68k_op_chk2cmp2_8_pcdi(void)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  if (((ushort)m68ki_cpu.cpu_type & 0x3f8) == 0) {
    m68ki_exception_illegal();
    return;
  }
  my_fc_handler(m68ki_cpu.s_flag | 2);
  uVar6 = m68ki_cpu.pc & m68ki_cpu.address_mask;
  m68ki_cpu.pc = m68ki_cpu.pc + 2;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar6 = pmmu_translate_addr(uVar6);
  }
  uVar2 = m68k_read_memory_16(uVar6 & m68ki_cpu.address_mask);
  uVar6 = m68ki_cpu.pc;
  bVar1 = *(byte *)((long)m68ki_cpu.dar + (ulong)(uVar2 >> 10 & 0x3c));
  m68ki_address_space = 2;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  uVar7 = m68ki_cpu.pc & m68ki_cpu.address_mask;
  m68ki_cpu.pc = m68ki_cpu.pc + 2;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar7 = pmmu_translate_addr(uVar7);
  }
  uVar3 = m68k_read_memory_16(uVar7 & m68ki_cpu.address_mask);
  uVar6 = (int)(short)uVar3 + uVar6;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  uVar7 = uVar6;
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar7 = pmmu_translate_addr(uVar6);
  }
  uVar3 = m68k_read_memory_8(uVar7 & m68ki_cpu.address_mask);
  uVar6 = uVar6 + 1;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar6 = pmmu_translate_addr(uVar6);
  }
  uVar4 = m68k_read_memory_8(uVar6 & m68ki_cpu.address_mask);
  uVar5 = (uint)(char)bVar1;
  if ((short)uVar2 < 0) {
    uVar5 = (uint)bVar1;
  }
  m68ki_cpu.not_z_flag = (uint)(uVar3 != uVar5 && uVar4 != uVar5);
  m68ki_cpu.c_flag =
       (uint)(((int)uVar4 < (int)uVar5 || (int)uVar4 < (int)uVar3) || (int)uVar5 < (int)uVar3) << 8;
  if (((uVar2 >> 0xb & 1) != 0) &&
     (((int)uVar4 < (int)uVar5 || (int)uVar4 < (int)uVar3) || (int)uVar5 < (int)uVar3)) {
    m68ki_exception_trap(6);
    return;
  }
  return;
}

Assistant:

static void m68k_op_chk2cmp2_8_pcdi(void)
{
	if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		uint word2 = OPER_I_16();
		sint compare = REG_DA[(word2 >> 12) & 15]&0xff;
		uint ea = EA_PCDI_8();
		sint lower_bound = m68ki_read_pcrel_8(ea);
		sint upper_bound = m68ki_read_pcrel_8(ea + 1);

		if(!BIT_F(word2))
			compare = (int32)(int8)compare;
      
		FLAG_Z = !((upper_bound==compare) || (lower_bound==compare));  // JFF: | => ||

    FLAG_C = (lower_bound <= upper_bound ? compare < lower_bound || compare > upper_bound : compare > upper_bound || compare < lower_bound) << 8;

		if(COND_CS() && BIT_B(word2))
				m68ki_exception_trap(EXCEPTION_CHK);
		return;
	}

      
	m68ki_exception_illegal();
}